

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O1

ps_config_t * ps_config_init(ps_arg_t *defn)

{
  char **ppcVar1;
  ps_config_t *ppVar2;
  ps_arg_t *ppVar3;
  hash_table_t *phVar4;
  cmd_ln_val_t *val;
  long lVar5;
  long lVar6;
  
  ppVar2 = (ps_config_t *)
           __ckd_calloc__(1,0x30,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                          ,0x37);
  ppVar2->refcount = 1;
  ppVar3 = ps_args_def;
  if (defn != (ps_arg_t *)0x0) {
    ppVar3 = defn;
  }
  ppVar2->defn = ppVar3;
  lVar6 = -1;
  do {
    lVar6 = lVar6 + 1;
    ppcVar1 = &ppVar3->name;
    ppVar3 = ppVar3 + 1;
  } while (*ppcVar1 != (char *)0x0);
  phVar4 = hash_table_new((int32)lVar6,0);
  ppVar2->ht = phVar4;
  if (lVar6 != 0) {
    lVar5 = 0x10;
    do {
      ppVar3 = ppVar2->defn;
      val = cmd_ln_val_init(*(int *)((long)ppVar3 + lVar5 + -8),
                            *(char **)((long)ppVar3 + lVar5 + -0x10),
                            *(char **)((long)&ppVar3->name + lVar5));
      if (val == (cmd_ln_val_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                ,0x49,"Bad default argument value for %s: %s\n",
                *(undefined8 *)((long)ppVar2->defn + lVar5 + -0x10),
                *(undefined8 *)((long)&ppVar2->defn->name + lVar5));
      }
      else {
        hash_table_enter(ppVar2->ht,val->name,val);
      }
      lVar5 = lVar5 + 0x20;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return ppVar2;
}

Assistant:

ps_config_t *
ps_config_init(const ps_arg_t *defn)
{
    ps_config_t *config = ckd_calloc(1, sizeof(*config));
    int i, ndef;
    
    config->refcount = 1;
    if (defn)
        config->defn = defn;
    else
        config->defn = ps_args_def;
    for (ndef = 0; config->defn[ndef].name; ndef++)
        ;
    config->ht = hash_table_new(ndef, FALSE);
    for (i = 0; i < ndef; i++) {
        cmd_ln_val_t *val;
        if ((val = cmd_ln_val_init(config->defn[i].type,
                                   config->defn[i].name,
                                   config->defn[i].deflt)) == NULL) {
            E_ERROR
                ("Bad default argument value for %s: %s\n",
                 config->defn[i].name, config->defn[i].deflt);
            continue;
        }
        hash_table_enter(config->ht, val->name, (void *)val);
    }
    return config;
}